

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O0

WebPMuxError WebPMuxNumChunks(WebPMux *mux,WebPChunkId id,int *num_elements)

{
  int iVar1;
  CHUNK_INDEX CVar2;
  WebPChunk **ppWVar3;
  WebPMuxImage *in_RDX;
  WebPChunkId in_ESI;
  WebPMux *in_RDI;
  CHUNK_INDEX idx;
  WebPChunk **chunk_list;
  undefined8 in_stack_ffffffffffffffd8;
  WebPMuxError local_4;
  
  if ((in_RDI == (WebPMux *)0x0) || (in_RDX == (WebPMuxImage *)0x0)) {
    local_4 = WEBP_MUX_INVALID_ARGUMENT;
  }
  else {
    iVar1 = IsWPI(in_ESI);
    if (iVar1 == 0) {
      ppWVar3 = MuxGetChunkListFromId(in_RDI,in_ESI);
      CVar2 = ChunkGetIndexFromId(in_ESI);
      iVar1 = CountChunks(*ppWVar3,kChunks[CVar2].tag);
      *(int *)&in_RDX->header_ = iVar1;
    }
    else {
      iVar1 = MuxImageCount(in_RDX,(WebPChunkId)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
      *(int *)&in_RDX->header_ = iVar1;
    }
    local_4 = WEBP_MUX_OK;
  }
  return local_4;
}

Assistant:

WebPMuxError WebPMuxNumChunks(const WebPMux* mux,
                              WebPChunkId id, int* num_elements) {
  if (mux == NULL || num_elements == NULL) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }

  if (IsWPI(id)) {
    *num_elements = MuxImageCount(mux->images_, id);
  } else {
    WebPChunk* const* chunk_list = MuxGetChunkListFromId(mux, id);
    const CHUNK_INDEX idx = ChunkGetIndexFromId(id);
    *num_elements = CountChunks(*chunk_list, kChunks[idx].tag);
  }

  return WEBP_MUX_OK;
}